

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  unsigned_short uVar1;
  CallInfo *pCVar2;
  unsigned_short uVar3;
  uint errcode;
  CallInfo **ppCVar4;
  StkId level;
  
  if (from == (lua_State *)0x0) {
    uVar3 = 1;
  }
  else {
    uVar3 = from->nCcalls + 1;
  }
  uVar1 = L->nny;
  L->nCcalls = uVar3;
  L->nny = 0;
  errcode = luaD_rawrunprotected(L,resume,L->top + -(long)nargs);
  if (errcode == 0xffffffff) {
    errcode = 2;
  }
  else {
    while (ppCVar4 = &L->ci, 1 < errcode) {
      while( true ) {
        pCVar2 = *ppCVar4;
        if (pCVar2 == (CallInfo *)0x0) {
          L->status = (lu_byte)errcode;
          seterrorobj(L,errcode,L->top);
          L->ci->top = L->top;
          goto LAB_001085ca;
        }
        if ((pCVar2->callstatus & 0x10) != 0) break;
        ppCVar4 = &pCVar2->previous;
      }
      level = (StkId)((long)&L->stack->value_ + pCVar2->extra);
      luaF_close(L,level);
      seterrorobj(L,errcode,level);
      L->ci = pCVar2;
      L->allowhook = (pCVar2->u).c.old_allowhook;
      L->nny = 0;
      luaD_shrinkstack(L);
      L->errfunc = (pCVar2->u).c.old_errfunc;
      pCVar2->callstatus = pCVar2->callstatus | 0x20;
      (pCVar2->u).c.status = (lu_byte)errcode;
      errcode = luaD_rawrunprotected(L,unroll,(void *)0x0);
    }
  }
LAB_001085ca:
  L->nny = uVar1;
  L->nCcalls = L->nCcalls - 1;
  return errcode;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs) {
  int status;
  int oldnny = L->nny;  /* save 'nny' */
  lua_lock(L);
  luai_userstateresume(L, nargs);
  L->nCcalls = (from) ? from->nCcalls + 1 : 1;
  L->nny = 0;  /* allow yields */
  api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, L->top - nargs);
  if (status == -1)  /* error calling 'lua_resume'? */
    status = LUA_ERRRUN;
  else {  /* yield or regular error */
    while (status != LUA_OK && status != LUA_YIELD) {  /* error? */
      if (recover(L, status))  /* recover point? */
        status = luaD_rawrunprotected(L, unroll, NULL);  /* run continuation */
      else {  /* unrecoverable error */
        L->status = cast_byte(status);  /* mark thread as `dead' */
        seterrorobj(L, status, L->top);
        L->ci->top = L->top;
        break;
      }
    }
    lua_assert(status == L->status);
  }
  L->nny = oldnny;  /* restore 'nny' */
  L->nCcalls--;
  lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
  lua_unlock(L);
  return status;
}